

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O1

int preprocessor_if(dmr_C *C,stream *stream,token *token,int true_value)

{
  token *ptVar1;
  int iVar2;
  token *entry;
  
  token->pos = (position)
               ((((ulong)token->pos & 0xffffffffffffffc0) - (ulong)(C->false_nesting == 0)) + 0x1c);
  if (((ulong)token->next->pos & 0x3f) != 0) {
    entry = token->next;
    do {
      ptVar1 = entry->next;
      dmrC_allocator_free(&C->token_allocator,entry);
      entry = ptVar1;
    } while (((ulong)ptVar1->pos & 0x3f) != 0);
  }
  token->next = stream->top_if;
  stream->top_if = token;
  iVar2 = C->false_nesting;
  if (true_value != 1 || iVar2 != 0) {
    iVar2 = iVar2 + 1;
    C->false_nesting = iVar2;
  }
  return iVar2;
}

Assistant:

static int preprocessor_if(struct dmr_C *C, struct stream *stream, struct token *token, int true_value)
{
	dmrC_token_type(token) = C->false_nesting ? TOKEN_SKIP_GROUPS : TOKEN_IF;
	free_preprocessor_line(C, token->next);
	token->next = stream->top_if;
	stream->top_if = token;
	if (C->false_nesting || true_value != 1)
		C->false_nesting++;
	return 0;
}